

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

uint64_t calc_amplification_limit_allowance(quicly_conn_t *conn)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  ulong uVar3;
  
  if (((uint)(conn->super).remote.address_validation & 1) == 0) {
    uVar3 = (ulong)((conn->super).ctx)->pre_validation_amplification_limit *
            (conn->super).stats.num_bytes.received;
    puVar1 = &(conn->super).stats.num_bytes.sent;
    uVar2 = 0;
    if (*puVar1 <= uVar3) {
      uVar2 = uVar3 - *puVar1;
    }
    return uVar2;
  }
  return 0xffffffffffffffff;
}

Assistant:

static inline uint64_t calc_amplification_limit_allowance(quicly_conn_t *conn)
{
    if (conn->super.remote.address_validation.validated)
        return UINT64_MAX;
    uint64_t budget = conn->super.stats.num_bytes.received * conn->super.ctx->pre_validation_amplification_limit;
    if (budget <= conn->super.stats.num_bytes.sent)
        return 0;
    return budget - conn->super.stats.num_bytes.sent;
}